

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::sdiv(APInt *this,int64_t RHS)

{
  uint uVar1;
  bool bVar2;
  anon_union_8_2_1313ab2f_for_U aVar3;
  long in_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar5;
  APInt AVar6;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  bVar2 = operator[]((APInt *)RHS,*(int *)(RHS + 8) - 1);
  if (bVar2) {
    if (in_RDX < 0) {
      local_68 = *(uint *)(RHS + 8);
      if ((ulong)local_68 < 0x41) {
        aVar3 = *(anon_union_8_2_1313ab2f_for_U *)RHS;
      }
      else {
        uVar5 = (ulong)((uint)((ulong)local_68 + 0x3f >> 3) & 0xfffffff8);
        aVar3.pVal = (uint64_t *)operator_new__(uVar5);
        memcpy(aVar3.pVal,*(void **)RHS,uVar5);
      }
      local_70 = aVar3;
      flipAllBits((APInt *)&local_70);
      operator++((APInt *)&local_70);
      local_58 = local_68;
      local_60.VAL = local_70.VAL;
      local_68 = 0;
      AVar6 = udiv(this,(uint64_t)&local_60);
      uVar4 = AVar6._8_8_;
      aVar3 = local_70;
      uVar1 = local_68;
      if ((0x40 < local_58) && ((void *)local_60.VAL != (void *)0x0)) {
        operator_delete__(local_60.pVal);
        uVar4 = extraout_RDX_02;
        aVar3 = local_70;
        uVar1 = local_68;
      }
    }
    else {
      local_78 = *(uint *)(RHS + 8);
      if ((ulong)local_78 < 0x41) {
        aVar3 = *(anon_union_8_2_1313ab2f_for_U *)RHS;
      }
      else {
        uVar5 = (ulong)((uint)((ulong)local_78 + 0x3f >> 3) & 0xfffffff8);
        aVar3.pVal = (uint64_t *)operator_new__(uVar5);
        memcpy(aVar3.pVal,*(void **)RHS,uVar5);
      }
      local_80 = aVar3;
      flipAllBits((APInt *)&local_80);
      operator++((APInt *)&local_80);
      local_58 = local_78;
      local_60 = local_80;
      local_78 = 0;
      udiv((APInt *)&local_40,(uint64_t)&local_60);
      flipAllBits((APInt *)&local_40);
      operator++((APInt *)&local_40);
      this->BitWidth = local_38;
      this->U = local_40;
      local_38 = 0;
      uVar4 = extraout_RDX_00;
      aVar3 = local_80;
      uVar1 = local_78;
      if ((0x40 < local_58) && ((void *)local_60.VAL != (void *)0x0)) {
        operator_delete__(local_60.pVal);
        uVar4 = extraout_RDX_01;
        aVar3 = local_80;
        uVar1 = local_78;
      }
    }
    if ((0x40 < uVar1) && ((void *)aVar3.VAL != (void *)0x0)) {
      operator_delete__(aVar3.pVal);
      uVar4 = extraout_RDX_03;
    }
  }
  else if (in_RDX < 0) {
    udiv((APInt *)&local_50,RHS);
    flipAllBits((APInt *)&local_50);
    operator++((APInt *)&local_50);
    this->BitWidth = local_48;
    this->U = local_50;
    uVar4 = extraout_RDX;
  }
  else {
    AVar6 = udiv(this,RHS);
    uVar4 = AVar6._8_8_;
  }
  AVar6._8_8_ = uVar4;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::sdiv(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS < 0)
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}